

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

type __thiscall
dg::pta::PointerGraph::
nodeFactory<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&,dg::pta::PSNodeGep>
          (PointerGraph *this,PSNode **args,unsigned_long *args_1)

{
  int iVar1;
  PSNodeGep *this_00;
  
  this_00 = (PSNodeGep *)operator_new(0xf0);
  iVar1 = *(int *)(this + 0x40);
  *(IDType *)(this + 0x40) = iVar1 + 1U;
  PSNodeGep::PSNodeGep(this_00,iVar1 + 1U,*args,(Offset)*args_1);
  return this_00;
}

Assistant:

typename std::enable_if<!std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        return new Node(getNewNodeId(), std::forward<Args>(args)...);
    }